

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::is2DTrilinearFilterResultValid
               (LookupPrecision *prec,ColorQuad *quad0,ColorQuad *quad1,Vec2 *xBounds0,
               Vec2 *yBounds0,Vec2 *xBounds1,Vec2 *yBounds1,Vec2 *zBounds,float searchStep,
               Vec4 *result)

{
  bool bVar1;
  float fVar2;
  Vector<float,_4> local_1c4;
  Vector<float,_4> local_1b4;
  Vector<float,_4> local_1a4;
  Vector<float,_4> local_194;
  Vector<float,_4> local_184;
  Vector<float,_4> local_174;
  Vector<float,_4> local_164;
  Vector<float,_4> local_154;
  Vector<float,_4> local_144;
  Vector<float,_4> local_134;
  undefined1 local_124 [8];
  Vec4 c1;
  float b1;
  float a1;
  float y1;
  float x1;
  Vector<float,_4> local_f4;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  Vector<float,_4> local_c4;
  Vector<float,_4> local_b4;
  Vector<float,_4> local_a4;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  undefined1 local_64 [8];
  Vec4 c0;
  float b0;
  float a0;
  float y0;
  float x0;
  float searchStep_local;
  Vec2 *xBounds1_local;
  Vec2 *yBounds0_local;
  Vec2 *xBounds0_local;
  ColorQuad *quad1_local;
  ColorQuad *quad0_local;
  LookupPrecision *prec_local;
  
  bVar1 = isInColorBounds(prec,quad0,quad1,result);
  if (bVar1) {
    for (a0 = Vector<float,_2>::x(xBounds0); fVar2 = Vector<float,_2>::y(xBounds0),
        a0 < fVar2 + searchStep; a0 = searchStep + a0) {
      for (b0 = Vector<float,_2>::x(yBounds0); fVar2 = Vector<float,_2>::y(yBounds0),
          b0 < fVar2 + searchStep; b0 = searchStep + b0) {
        fVar2 = Vector<float,_2>::y(xBounds0);
        c0.m_data[3] = de::min<float>(a0,fVar2);
        fVar2 = Vector<float,_2>::y(yBounds0);
        c0.m_data[2] = de::min<float>(b0,fVar2);
        operator*((tcu *)&local_a4,&quad0->p00,1.0 - c0.m_data[3]);
        operator*((tcu *)&local_94,&local_a4,1.0 - c0.m_data[2]);
        operator*((tcu *)&local_c4,&quad0->p10,c0.m_data[3]);
        operator*((tcu *)&local_b4,&local_c4,1.0 - c0.m_data[2]);
        operator+((tcu *)&local_84,&local_94,&local_b4);
        operator*((tcu *)&local_e4,&quad0->p01,1.0 - c0.m_data[3]);
        operator*((tcu *)&local_d4,&local_e4,c0.m_data[2]);
        operator+((tcu *)&local_74,&local_84,&local_d4);
        operator*((tcu *)&y1,&quad0->p11,c0.m_data[3]);
        operator*((tcu *)&local_f4,(Vector<float,_4> *)&y1,c0.m_data[2]);
        operator+((tcu *)local_64,&local_74,&local_f4);
        for (a1 = Vector<float,_2>::x(xBounds1); fVar2 = Vector<float,_2>::y(xBounds1), a1 <= fVar2;
            a1 = searchStep + a1) {
          for (b1 = Vector<float,_2>::x(yBounds1); fVar2 = Vector<float,_2>::y(yBounds1),
              b1 <= fVar2; b1 = searchStep + b1) {
            fVar2 = Vector<float,_2>::y(xBounds1);
            c1.m_data[3] = de::min<float>(a1,fVar2);
            fVar2 = Vector<float,_2>::y(yBounds1);
            c1.m_data[2] = de::min<float>(b1,fVar2);
            operator*((tcu *)&local_164,&quad1->p00,1.0 - c1.m_data[3]);
            operator*((tcu *)&local_154,&local_164,1.0 - c1.m_data[2]);
            operator*((tcu *)&local_184,&quad1->p10,c1.m_data[3]);
            operator*((tcu *)&local_174,&local_184,1.0 - c1.m_data[2]);
            operator+((tcu *)&local_144,&local_154,&local_174);
            operator*((tcu *)&local_1a4,&quad1->p01,1.0 - c1.m_data[3]);
            operator*((tcu *)&local_194,&local_1a4,c1.m_data[2]);
            operator+((tcu *)&local_134,&local_144,&local_194);
            operator*((tcu *)&local_1c4,&quad1->p11,c1.m_data[3]);
            operator*((tcu *)&local_1b4,&local_1c4,c1.m_data[2]);
            operator+((tcu *)local_124,&local_134,&local_1b4);
            bVar1 = isLinearRangeValid(prec,(Vec4 *)local_64,(Vec4 *)local_124,zBounds,result);
            if (bVar1) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool is2DTrilinearFilterResultValid (const LookupPrecision&	prec,
											const ColorQuad&		quad0,
											const ColorQuad&		quad1,
											const Vec2&				xBounds0,
											const Vec2&				yBounds0,
											const Vec2&				xBounds1,
											const Vec2&				yBounds1,
											const Vec2&				zBounds,
											const float				searchStep,
											const Vec4&				result)
{
	DE_ASSERT(xBounds0.x() <= xBounds0.y());
	DE_ASSERT(yBounds0.x() <= yBounds0.y());
	DE_ASSERT(xBounds1.x() <= xBounds1.y());
	DE_ASSERT(yBounds1.x() <= yBounds1.y());
	DE_ASSERT(xBounds0.x() + searchStep > xBounds0.x()); // step is not effectively 0
	DE_ASSERT(xBounds0.y() + searchStep > xBounds0.y());
	DE_ASSERT(yBounds0.x() + searchStep > yBounds0.x());
	DE_ASSERT(yBounds0.y() + searchStep > yBounds0.y());
	DE_ASSERT(xBounds1.x() + searchStep > xBounds1.x());
	DE_ASSERT(xBounds1.y() + searchStep > xBounds1.y());
	DE_ASSERT(yBounds1.x() + searchStep > yBounds1.x());
	DE_ASSERT(yBounds1.y() + searchStep > yBounds1.y());

	if (!isInColorBounds(prec, quad0, quad1, result))
		return false;

	for (float x0 = xBounds0.x(); x0 < xBounds0.y()+searchStep; x0 += searchStep)
	{
		for (float y0 = yBounds0.x(); y0 < yBounds0.y()+searchStep; y0 += searchStep)
		{
			const float		a0	= de::min(x0, xBounds0.y());
			const float		b0	= de::min(y0, yBounds0.y());
			const Vec4		c0	= quad0.p00*(1.0f-a0)*(1.0f-b0) + quad0.p10*a0*(1.0f-b0) + quad0.p01*(1.0f-a0)*b0 + quad0.p11*a0*b0;

			for (float x1 = xBounds1.x(); x1 <= xBounds1.y(); x1 += searchStep)
			{
				for (float y1 = yBounds1.x(); y1 <= yBounds1.y(); y1 += searchStep)
				{
					const float		a1	= de::min(x1, xBounds1.y());
					const float		b1	= de::min(y1, yBounds1.y());
					const Vec4		c1	= quad1.p00*(1.0f-a1)*(1.0f-b1) + quad1.p10*a1*(1.0f-b1) + quad1.p01*(1.0f-a1)*b1 + quad1.p11*a1*b1;

					if (isLinearRangeValid(prec, c0, c1, zBounds, result))
						return true;
				}
			}
		}
	}

	return false;
}